

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O0

void apx_allocator_start(apx_allocator_t *self)

{
  apx_allocator_t *self_local;
  
  if ((self != (apx_allocator_t *)0x0) && ((self->workerThreadValid & 1U) == 0)) {
    apx_allocator_startThread(self);
  }
  return;
}

Assistant:

void apx_allocator_start(apx_allocator_t *self)
{
#ifndef UNIT_TEST
   if( (self != 0) && (self->workerThreadValid == false) )
   {
      apx_allocator_startThread(self);
   }
#else
   (void)self;
#endif
}